

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O3

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceOutputNameComponent
          (VClient *this,string *i_rDeviceName,uint i_DeviceOutputIndex,string *o_rDeviceOutputName,
          string *o_rComponentName,Enum *o_rDeviceOutputUnit)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  Enum EVar4;
  int iVar5;
  uint uVar6;
  Enum EVar7;
  string *psVar8;
  VClient *this_00;
  pointer rChannel;
  pointer pVVar9;
  uint DeviceID;
  Enum GetResult;
  scoped_lock Lock;
  uint local_74;
  Enum *local_70;
  Enum local_64;
  unique_lock<boost::recursive_mutex> local_60;
  undefined1 local_50 [32];
  
  local_60.m = &this->m_FrameMutex;
  local_60.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_60);
  local_64 = Success;
  local_70 = o_rDeviceOutputUnit;
  bVar3 = InitGet<std::__cxx11::string,std::__cxx11::string,ViconDataStreamSDK::Core::Unit::Enum>
                    (this,&local_64,o_rDeviceOutputName,o_rComponentName,o_rDeviceOutputUnit);
  EVar4 = local_64;
  if (bVar3) {
    local_74 = 0;
    EVar4 = GetDeviceID(this,i_rDeviceName,&local_74);
    if (EVar4 == Success) {
      bVar3 = IsForcePlateDevice(this,local_74);
      rChannel = (this->m_LatestFrame).m_Channels.
                 super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVVar1 = (this->m_LatestFrame).m_Channels.
               super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      EVar4 = InvalidIndex;
      if (rChannel != pVVar1) {
        uVar6 = 0;
        do {
          if (rChannel->m_DeviceID == local_74) {
            for (psVar8 = (rChannel->m_ComponentNames).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                psVar8 != (rChannel->m_ComponentNames).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
              if (i_DeviceOutputIndex == uVar6) {
                std::__cxx11::string::_M_assign((string *)o_rDeviceOutputName);
                ClientUtils::AdaptDeviceOutputName((string *)local_50,psVar8,i_DeviceOutputIndex);
                std::__cxx11::string::operator=((string *)o_rComponentName,(string *)local_50);
                this_00 = (VClient *)local_50._0_8_;
                if ((VClient *)local_50._0_8_ != (VClient *)(local_50 + 0x10)) {
                  operator_delete((void *)local_50._0_8_);
                  this_00 = (VClient *)local_50._0_8_;
                }
                if (!bVar3) {
                  *local_70 = Unknown;
                  pVVar9 = (this->m_LatestFrame).m_ChannelUnits.
                           super__Vector_base<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pVVar2 = (this->m_LatestFrame).m_ChannelUnits.
                           super__Vector_base<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  goto joined_r0x0012c935;
                }
                bVar3 = IsForcePlateForceChannel(this_00,rChannel);
                EVar7 = Newton;
                if (!bVar3) {
                  bVar3 = IsForcePlateMomentChannel(this_00,rChannel);
                  EVar7 = NewtonMeter;
                  if (!bVar3) {
                    bVar3 = IsForcePlateCoPChannel(this_00,rChannel);
                    EVar7 = (uint)bVar3 + (uint)bVar3 * 2 + Volt;
                  }
                }
                *local_70 = EVar7;
                EVar4 = Success;
                goto LAB_0012c864;
              }
              uVar6 = uVar6 + 1;
            }
          }
          rChannel = rChannel + 1;
        } while (rChannel != pVVar1);
        EVar4 = InvalidIndex;
      }
    }
  }
LAB_0012c864:
  if (local_60.is_locked == true) {
    boost::recursive_mutex::unlock(local_60.m);
  }
  return EVar4;
joined_r0x0012c935:
  EVar4 = Success;
  if (pVVar9 == pVVar2) goto LAB_0012c864;
  psVar8 = (string *)((long)pVVar9 + 0x10);
  if ((*(UInt32 *)((long)(psVar8 + -1) + 0x18) == local_74) &&
     (*(UInt32 *)((long)(psVar8 + -1) + 0x1c) == rChannel->m_ChannelID)) {
    iVar5 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar5 == 0) {
      EVar7 = Meter;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar5 == 0) {
        EVar7 = Kilogram;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar8);
        if (iVar5 == 0) {
          EVar7 = Second;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar5 == 0) {
            EVar7 = Ampere;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)psVar8);
            if (iVar5 == 0) {
              EVar7 = Kelvin;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)psVar8);
              if (iVar5 == 0) {
                EVar7 = Mole;
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)psVar8);
                if (iVar5 == 0) {
                  EVar7 = Candela;
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)psVar8);
                  if (iVar5 == 0) {
                    EVar7 = Radian;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)psVar8);
                    if (iVar5 == 0) {
                      EVar7 = Steradian;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)psVar8);
                      if (iVar5 == 0) {
                        EVar7 = MeterSquared;
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)psVar8);
                        if (iVar5 == 0) {
                          EVar7 = MeterCubed;
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)psVar8);
                          if (iVar5 == 0) {
                            EVar7 = MeterPerSecond;
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)psVar8);
                            if (iVar5 == 0) {
                              EVar7 = MeterPerSecondSquared;
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)psVar8);
                              if (iVar5 == 0) {
                                EVar7 = RadianPerSecond;
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)psVar8);
                                if (iVar5 == 0) {
                                  EVar7 = RadianPerSecondSquared;
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)psVar8);
                                  if (iVar5 == 0) {
                                    EVar7 = Hertz;
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)psVar8);
                                    if (iVar5 == 0) {
                                      EVar7 = Newton;
                                    }
                                    else {
                                      iVar5 = std::__cxx11::string::compare((char *)psVar8);
                                      if (iVar5 == 0) {
                                        EVar7 = Joule;
                                      }
                                      else {
                                        iVar5 = std::__cxx11::string::compare((char *)psVar8);
                                        if (iVar5 == 0) {
                                          EVar7 = Watt;
                                        }
                                        else {
                                          iVar5 = std::__cxx11::string::compare((char *)psVar8);
                                          if (iVar5 == 0) {
                                            EVar7 = Pascal;
                                          }
                                          else {
                                            iVar5 = std::__cxx11::string::compare((char *)psVar8);
                                            if (iVar5 == 0) {
                                              EVar7 = Lumen;
                                            }
                                            else {
                                              iVar5 = std::__cxx11::string::compare((char *)psVar8);
                                              if (iVar5 == 0) {
                                                EVar7 = Lux;
                                              }
                                              else {
                                                iVar5 = std::__cxx11::string::compare
                                                                  ((char *)psVar8);
                                                if (iVar5 == 0) {
                                                  EVar7 = Coulomb;
                                                }
                                                else {
                                                  iVar5 = std::__cxx11::string::compare
                                                                    ((char *)psVar8);
                                                  if (iVar5 == 0) {
                                                    EVar7 = Volt;
                                                  }
                                                  else {
                                                    iVar5 = std::__cxx11::string::compare
                                                                      ((char *)psVar8);
                                                    if (iVar5 == 0) {
                                                      EVar7 = Ohm;
                                                    }
                                                    else {
                                                      iVar5 = std::__cxx11::string::compare
                                                                        ((char *)psVar8);
                                                      if (iVar5 == 0) {
                                                        EVar7 = Farad;
                                                      }
                                                      else {
                                                        iVar5 = std::__cxx11::string::compare
                                                                          ((char *)psVar8);
                                                        if (iVar5 == 0) {
                                                          EVar7 = Weber;
                                                        }
                                                        else {
                                                          iVar5 = std::__cxx11::string::compare
                                                                            ((char *)psVar8);
                                                          if (iVar5 == 0) {
                                                            EVar7 = Tesla;
                                                          }
                                                          else {
                                                            iVar5 = std::__cxx11::string::compare
                                                                              ((char *)psVar8);
                                                            if (iVar5 == 0) {
                                                              EVar7 = Henry;
                                                            }
                                                            else {
                                                              iVar5 = std::__cxx11::string::compare
                                                                                ((char *)psVar8);
                                                              if (iVar5 == 0) {
                                                                EVar7 = Siemens;
                                                              }
                                                              else {
                                                                iVar5 = std::__cxx11::string::
                                                                        compare((char *)psVar8);
                                                                if (iVar5 == 0) {
                                                                  EVar7 = Becquerel;
                                                                }
                                                                else {
                                                                  iVar5 = std::__cxx11::string::
                                                                          compare((char *)psVar8);
                                                                  if (iVar5 == 0) {
                                                                    EVar7 = Gray;
                                                                  }
                                                                  else {
                                                                    iVar5 = std::__cxx11::string::
                                                                            compare((char *)psVar8);
                                                                    if (iVar5 == 0) {
                                                                      EVar7 = Sievert;
                                                                    }
                                                                    else {
                                                                      iVar5 = std::__cxx11::string::
                                                                              compare((char *)psVar8
                                                                                     );
                                                                      if (iVar5 != 0)
                                                                      goto LAB_0012cd9c;
                                                                      EVar7 = Katal;
                                                                    }
                                                                  }
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    *local_70 = EVar7;
  }
LAB_0012cd9c:
  pVVar9 = (pointer)(psVar8 + 2);
  goto joined_r0x0012c935;
}

Assistant:

Result::Enum VClient::GetDeviceOutputNameComponent( const std::string  & i_rDeviceName,
                                           const unsigned int   i_DeviceOutputIndex,
                                                 std::string  & o_rDeviceOutputName,
                                                 std::string  & o_rComponentName,
                                                 Unit::Enum   & o_rDeviceOutputUnit ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceOutputName, o_rComponentName, o_rDeviceOutputUnit ) )
  {
    return GetResult; 
  }

  // Get the device id
  unsigned int DeviceID = 0;
  Result::Enum _Result = GetDeviceID( i_rDeviceName, DeviceID );
  if( Result::Success != _Result )
  {
    return _Result;
  }

  // Is this a forceplate?
  const bool bIsForcePlate( IsForcePlateDevice( DeviceID ) );

  // Iterate over the channels for this device
  unsigned int CurrentDeviceOutputIndex = 0;
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelIt  = m_LatestFrame.m_Channels.begin();
  const std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelEnd = m_LatestFrame.m_Channels.end();
  for( ; ChannelIt != ChannelEnd ; ++ChannelIt )
  {
    const ViconCGStream::VChannelInfo & rChannel( *ChannelIt );

    // Wrong device
    if( rChannel.m_DeviceID != DeviceID )
    {
      continue;
    }

    std::vector< std::string >::const_iterator ComponentIt  = rChannel.m_ComponentNames.begin();
    std::vector< std::string >::const_iterator ComponentEnd = rChannel.m_ComponentNames.end();
    for( ; ComponentIt != ComponentEnd ; ++ComponentIt )
    {
      if( CurrentDeviceOutputIndex == i_DeviceOutputIndex )
      {
        o_rDeviceOutputName = rChannel.m_Name;
        o_rComponentName = AdaptDeviceOutputName( *ComponentIt, CurrentDeviceOutputIndex );

        if( bIsForcePlate )
        {
          // Determine where the data lives in this channel
          if( IsForcePlateForceChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::Newton;
          }
          else if( IsForcePlateMomentChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::NewtonMeter;
          }
          else if( IsForcePlateCoPChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::Meter;
          }
          else
          {
            o_rDeviceOutputUnit = Unit::Volt;
          }
        }
        else
        {
          // Not a forceplate.
          o_rDeviceOutputUnit = Unit::Unknown;

          // Look for information in the extra channel information.

          std::vector< ViconCGStream::VChannelInfoExtra >::const_iterator ChannelUnitIt  = m_LatestFrame.m_ChannelUnits.begin();
          const std::vector< ViconCGStream::VChannelInfoExtra >::const_iterator ChannelUnitEnd = m_LatestFrame.m_ChannelUnits.end();
          for( ; ChannelUnitIt != ChannelUnitEnd ; ++ChannelUnitIt )
          {
            const ViconCGStream::VChannelInfoExtra & rChannelInfoExtra( *ChannelUnitIt );

            // Wrong Device
            if( rChannelInfoExtra.m_DeviceID != DeviceID )
            {
              continue;
            }

            // Wrong Channel
            if( rChannelInfoExtra.m_ChannelID != rChannel.m_ChannelID )
            {
              continue;
            }

            if( rChannelInfoExtra.m_Unit == "meter" )
            {
              o_rDeviceOutputUnit = Unit::Meter;
            }
            else if( rChannelInfoExtra.m_Unit == "kilogram" )
            {
              o_rDeviceOutputUnit = Unit::Kilogram;
            }
            else if( rChannelInfoExtra.m_Unit == "second" )
            {
              o_rDeviceOutputUnit = Unit::Second;
            }
            else if( rChannelInfoExtra.m_Unit == "ampere" )
            {
              o_rDeviceOutputUnit = Unit::Ampere;
            }
            else if( rChannelInfoExtra.m_Unit == "kelvin" )
            {
              o_rDeviceOutputUnit = Unit::Kelvin;
            }
            else if( rChannelInfoExtra.m_Unit == "mole" )
            {
              o_rDeviceOutputUnit = Unit::Mole;
            }
            else if( rChannelInfoExtra.m_Unit == "candela" )
            {
              o_rDeviceOutputUnit = Unit::Candela;
            }
            else if( rChannelInfoExtra.m_Unit == "radian" )
            {
              o_rDeviceOutputUnit = Unit::Radian;
            }
            else if( rChannelInfoExtra.m_Unit == "steradian" )
            {
              o_rDeviceOutputUnit = Unit::Steradian;
            }
            else if( rChannelInfoExtra.m_Unit == "meter squared" )
            {
              o_rDeviceOutputUnit = Unit::MeterSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "meter cubed" )
            {
              o_rDeviceOutputUnit = Unit::MeterCubed;
            }
            else if( rChannelInfoExtra.m_Unit == "meter per second" )
            {
              o_rDeviceOutputUnit = Unit::MeterPerSecond;
            }
            else if( rChannelInfoExtra.m_Unit == "meter per second squared" )
            {
              o_rDeviceOutputUnit = Unit::MeterPerSecondSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "radian per second" )
            {
              o_rDeviceOutputUnit = Unit::RadianPerSecond;
            }
            else if( rChannelInfoExtra.m_Unit == "radian per second squared" )
            {
              o_rDeviceOutputUnit = Unit::RadianPerSecondSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "hertz" )
            {
              o_rDeviceOutputUnit = Unit::Hertz;
            }
            else if( rChannelInfoExtra.m_Unit == "newton" )
            {
              o_rDeviceOutputUnit = Unit::Newton;
            }
            else if( rChannelInfoExtra.m_Unit == "joule" )
            {
              o_rDeviceOutputUnit = Unit::Joule;
            }
            else if( rChannelInfoExtra.m_Unit == "watt" )
            {
              o_rDeviceOutputUnit = Unit::Watt;
            }
            else if( rChannelInfoExtra.m_Unit == "pascal" )
            {
              o_rDeviceOutputUnit = Unit::Pascal;
            }
            else if( rChannelInfoExtra.m_Unit == "lumen" )
            {
              o_rDeviceOutputUnit = Unit::Lumen;
            }
            else if( rChannelInfoExtra.m_Unit == "lux" )
            {
              o_rDeviceOutputUnit = Unit::Lux;
            }
            else if( rChannelInfoExtra.m_Unit == "coulomb" )
            {
              o_rDeviceOutputUnit = Unit::Coulomb;
            }
            else if( rChannelInfoExtra.m_Unit == "volt" )
            {
              o_rDeviceOutputUnit = Unit::Volt;
            }
            else if( rChannelInfoExtra.m_Unit == "ohm" )
            {
              o_rDeviceOutputUnit = Unit::Ohm;
            }
            else if( rChannelInfoExtra.m_Unit == "farad" )
            {
              o_rDeviceOutputUnit = Unit::Farad;
            }
            else if( rChannelInfoExtra.m_Unit == "weber" )
            {
              o_rDeviceOutputUnit = Unit::Weber;
            }
            else if( rChannelInfoExtra.m_Unit == "tesla" )
            {
              o_rDeviceOutputUnit = Unit::Tesla;
            }
            else if( rChannelInfoExtra.m_Unit == "henry" )
            {
              o_rDeviceOutputUnit = Unit::Henry;
            }
            else if( rChannelInfoExtra.m_Unit == "siemens" )
            {
              o_rDeviceOutputUnit = Unit::Siemens;
            }
            else if( rChannelInfoExtra.m_Unit == "becquerel" )
            {
              o_rDeviceOutputUnit = Unit::Becquerel;
            }
            else if( rChannelInfoExtra.m_Unit == "gray" )
            {
              o_rDeviceOutputUnit = Unit::Gray;
            }
            else if( rChannelInfoExtra.m_Unit == "sievert" )
            {
              o_rDeviceOutputUnit = Unit::Sievert;
            }
            else if( rChannelInfoExtra.m_Unit == "katal" )
            {
              o_rDeviceOutputUnit = Unit::Katal;
            }

          }
        }

        return Result::Success;
      }
      else
      {
        ++CurrentDeviceOutputIndex;
      }
    }
  }
  return Result::InvalidIndex;
}